

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_pcm_f32_to_s16(void *dst,void *src,ma_uint64 count,ma_dither_mode ditherMode)

{
  ulong uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  int iVar4;
  int iVar5;
  ma_lcg mVar6;
  int iVar7;
  ulong uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  fVar11 = 0.0;
  fVar12 = 0.0;
  if (ditherMode != ma_dither_mode_none) {
    fVar12 = 3.051851e-05;
    fVar11 = -3.0517578e-05;
  }
  if (count < 4) {
    uVar1 = 0;
  }
  else {
    fVar13 = 0.0;
    if (ditherMode != ma_dither_mode_none) {
      fVar13 = 6.103609e-05;
    }
    uVar8 = count >> 2;
    fVar17 = 0.0 - fVar11;
    uVar1 = 0;
    mVar6.state = g_maLCG.state;
    do {
      if (ditherMode == ma_dither_mode_triangle) {
        iVar4 = mVar6.state * 0xbc8f;
        iVar4 = iVar4 + ((int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f)) * -0x7fffffff;
        iVar5 = iVar4 * 0xbc8f;
        iVar7 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        mVar6.state = iVar7 * -0x80000000 + iVar5 + iVar7;
        fVar14 = ((float)mVar6.state / 2.1474836e+09) * fVar12 + 0.0 +
                 ((float)iVar4 / 2.1474836e+09) * fVar17 + fVar11;
        g_maLCG.state = mVar6.state;
      }
      else {
        fVar14 = 0.0;
        if (ditherMode == ma_dither_mode_rectangle) {
          iVar4 = mVar6.state * 0xbc8f;
          iVar5 = (int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f);
          mVar6.state = iVar5 * -0x80000000 + iVar4 + iVar5;
          fVar14 = ((float)mVar6.state / 2.1474836e+09) * fVar13 + fVar11;
          g_maLCG.state = mVar6.state;
        }
      }
      if (ditherMode == ma_dither_mode_triangle) {
        iVar4 = mVar6.state * 0xbc8f;
        iVar4 = iVar4 + ((int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f)) * -0x7fffffff;
        iVar5 = iVar4 * 0xbc8f;
        iVar7 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        mVar6.state = iVar7 * -0x80000000 + iVar5 + iVar7;
        fVar15 = ((float)mVar6.state / 2.1474836e+09) * fVar12 + 0.0 +
                 ((float)iVar4 / 2.1474836e+09) * fVar17 + fVar11;
        g_maLCG.state = mVar6.state;
      }
      else {
        fVar15 = 0.0;
        if (ditherMode == ma_dither_mode_rectangle) {
          iVar4 = mVar6.state * 0xbc8f;
          iVar5 = (int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f);
          mVar6.state = iVar5 * -0x80000000 + iVar4 + iVar5;
          fVar15 = ((float)mVar6.state / 2.1474836e+09) * fVar13 + fVar11;
          g_maLCG.state = mVar6.state;
        }
      }
      if (ditherMode == ma_dither_mode_triangle) {
        iVar4 = mVar6.state * 0xbc8f;
        iVar4 = iVar4 + ((int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f)) * -0x7fffffff;
        iVar5 = iVar4 * 0xbc8f;
        iVar7 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        mVar6.state = iVar7 * -0x80000000 + iVar5 + iVar7;
        fVar16 = ((float)mVar6.state / 2.1474836e+09) * fVar12 + 0.0 +
                 ((float)iVar4 / 2.1474836e+09) * fVar17 + fVar11;
        g_maLCG.state = mVar6.state;
      }
      else {
        fVar16 = 0.0;
        if (ditherMode == ma_dither_mode_rectangle) {
          iVar4 = mVar6.state * 0xbc8f;
          iVar5 = (int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f);
          mVar6.state = iVar5 * -0x80000000 + iVar4 + iVar5;
          fVar16 = ((float)mVar6.state / 2.1474836e+09) * fVar13 + fVar11;
          g_maLCG.state = mVar6.state;
        }
      }
      if (ditherMode == ma_dither_mode_triangle) {
        iVar4 = mVar6.state * 0xbc8f;
        iVar4 = iVar4 + ((int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f)) * -0x7fffffff;
        iVar5 = iVar4 * 0xbc8f;
        iVar7 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        mVar6.state = iVar7 * -0x80000000 + iVar5 + iVar7;
        fVar18 = ((float)mVar6.state / 2.1474836e+09) * fVar12 + 0.0 +
                 ((float)iVar4 / 2.1474836e+09) * fVar17 + fVar11;
        g_maLCG.state = mVar6.state;
      }
      else {
        fVar18 = 0.0;
        if (ditherMode == ma_dither_mode_rectangle) {
          iVar4 = mVar6.state * 0xbc8f;
          iVar5 = (int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f);
          mVar6.state = iVar5 * -0x80000000 + iVar4 + iVar5;
          fVar18 = ((float)mVar6.state / 2.1474836e+09) * fVar13 + fVar11;
          g_maLCG.state = mVar6.state;
        }
      }
      fVar14 = fVar14 + *(float *)((long)src + uVar1 * 4);
      fVar15 = fVar15 + *(float *)((long)src + uVar1 * 4 + 4);
      fVar16 = fVar16 + *(float *)((long)src + uVar1 * 4 + 8);
      fVar18 = fVar18 + *(float *)((long)src + uVar1 * 4 + 0xc);
      uVar9 = 0x8001;
      uVar10 = 0x8001;
      if (-1.0 <= fVar14) {
        fVar19 = 1.0;
        if (fVar14 <= 1.0) {
          fVar19 = fVar14;
        }
        uVar10 = (undefined2)(int)(fVar19 * 32767.0);
      }
      if (-1.0 <= fVar15) {
        fVar14 = 1.0;
        if (fVar15 <= 1.0) {
          fVar14 = fVar15;
        }
        uVar9 = (undefined2)(int)(fVar14 * 32767.0);
      }
      uVar2 = 0x8001;
      uVar3 = 0x8001;
      if (-1.0 <= fVar16) {
        fVar14 = 1.0;
        if (fVar16 <= 1.0) {
          fVar14 = fVar16;
        }
        uVar3 = (undefined2)(int)(fVar14 * 32767.0);
      }
      if (-1.0 <= fVar18) {
        fVar14 = 1.0;
        if (fVar18 <= 1.0) {
          fVar14 = fVar18;
        }
        uVar2 = (undefined2)(int)(fVar14 * 32767.0);
      }
      *(undefined2 *)((long)dst + uVar1 * 2) = uVar10;
      *(undefined2 *)((long)dst + uVar1 * 2 + 2) = uVar9;
      *(undefined2 *)((long)dst + uVar1 * 2 + 4) = uVar3;
      *(undefined2 *)((long)dst + uVar1 * 2 + 6) = uVar2;
      uVar1 = uVar1 + 4;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if (uVar1 < count) {
    fVar13 = 0.0;
    if (ditherMode != ma_dither_mode_none) {
      fVar13 = 6.103609e-05;
    }
    mVar6.state = g_maLCG.state;
    do {
      if (ditherMode == ma_dither_mode_triangle) {
        iVar4 = mVar6.state * 0xbc8f;
        iVar4 = iVar4 + ((int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f)) * -0x7fffffff;
        iVar5 = iVar4 * 0xbc8f;
        iVar7 = (int)((long)iVar5 * 0x40000001 >> 0x3d) - (iVar5 >> 0x1f);
        mVar6.state = iVar7 * -0x80000000 + iVar5 + iVar7;
        fVar17 = ((float)mVar6.state / 2.1474836e+09) * fVar12 + 0.0 +
                 ((float)iVar4 / 2.1474836e+09) * (0.0 - fVar11) + fVar11;
        g_maLCG.state = mVar6.state;
      }
      else {
        fVar17 = 0.0;
        if (ditherMode == ma_dither_mode_rectangle) {
          iVar4 = mVar6.state * 0xbc8f;
          iVar5 = (int)((long)iVar4 * 0x40000001 >> 0x3d) - (iVar4 >> 0x1f);
          mVar6.state = iVar5 * -0x80000000 + iVar4 + iVar5;
          fVar17 = ((float)mVar6.state / 2.1474836e+09) * fVar13 + fVar11;
          g_maLCG.state = mVar6.state;
        }
      }
      fVar17 = *(float *)((long)src + uVar1 * 4) + fVar17;
      uVar9 = 0x8001;
      if (-1.0 <= fVar17) {
        fVar14 = 1.0;
        if (fVar17 <= 1.0) {
          fVar14 = fVar17;
        }
        uVar9 = (undefined2)(int)(fVar14 * 32767.0);
      }
      *(undefined2 *)((long)dst + uVar1 * 2) = uVar9;
      uVar1 = uVar1 + 1;
    } while (count != uVar1);
  }
  return;
}

Assistant:

MA_API void ma_pcm_f32_to_s16(void* dst, const void* src, ma_uint64 count, ma_dither_mode ditherMode)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_f32_to_s16__reference(dst, src, count, ditherMode);
#else
    #  if MA_PREFERRED_SIMD == MA_SIMD_AVX2
        if (ma_has_avx2()) {
            ma_pcm_f32_to_s16__avx2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_SSE2
        if (ma_has_sse2()) {
            ma_pcm_f32_to_s16__sse2(dst, src, count, ditherMode);
        } else
    #elif MA_PREFERRED_SIMD == MA_SIMD_NEON
        if (ma_has_neon()) {
            ma_pcm_f32_to_s16__neon(dst, src, count, ditherMode);
        } else
    #endif
        {
            ma_pcm_f32_to_s16__optimized(dst, src, count, ditherMode);
        }
#endif
}